

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

void __thiscall
ft::
map<std::__cxx11::string,int,ft::less<std::__cxx11::string>,ft::allocator<ft::pair<std::__cxx11::string_const,int>>>
::insert<ft::pair<std::__cxx11::string,int>*>
          (map<std::__cxx11::string,int,ft::less<std::__cxx11::string>,ft::allocator<ft::pair<std::__cxx11::string_const,int>>>
           *this,pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                 *first,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
          *last,type *param_3)

{
  value_type local_70;
  pair<ft::treeIterator<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_ft::allocator<ft::treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>,_bool>
  local_48;
  type *local_28;
  type *param_3_local;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *last_local;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *first_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_ft::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::allocator<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_local;
  
  local_28 = param_3;
  param_3_local = last;
  first_local = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                 *)this;
  for (last_local = first;
      last_local !=
      (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *)
      param_3_local; last_local = last_local + 1) {
    pair<std::__cxx11::string_const,int>::pair<std::__cxx11::string,int>
              ((pair<std::__cxx11::string_const,int> *)&local_70,last_local);
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_ft::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::allocator<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::insert(&local_48,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_ft::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::allocator<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)this,&local_70);
    pair<ft::treeIterator<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_ft::allocator<ft::treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>,_bool>
    ::~pair(&local_48);
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::~pair(&local_70);
  }
  return;
}

Assistant:

void	insert(Iterator first, Iterator last,
			 		typename ft::_void_t<typename ft::iterator_traits<Iterator>::iterator_category>::type * = 0)
	{
		while (first != last)
		{
			this->insert(*first);
			++first;
		}
	}